

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O3

int __thiscall
ProgramStreamDemuxer::simpleDemuxBlock
          (ProgramStreamDemuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,
          int64_t *discardSize)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  long lVar5;
  byte *pbVar6;
  mapped_type *pmVar7;
  ulong *puVar8;
  undefined4 *puVar9;
  ushort uVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  byte *pbVar14;
  byte *pbVar15;
  pointer puVar16;
  size_t sVar17;
  void *pvVar18;
  byte *pbVar19;
  ulong uVar20;
  uint uVar21;
  map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
  *pmVar22;
  uint32_t uVar23;
  void *__src;
  byte *end;
  uint uVar24;
  uint uVar25;
  bool bVar26;
  int startcode;
  uint32_t readedBytes;
  int afterPesHeader;
  int readRez;
  ostringstream ss;
  uint local_238;
  uint local_234;
  pointer local_230;
  long *local_228;
  DemuxedData *local_220;
  int local_214;
  mapped_type *local_210;
  int local_204;
  byte *local_200;
  MemoryBlock *local_1f8;
  map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_> *local_1f0;
  _Rb_tree_header *local_1e8;
  _Base_ptr local_1e0;
  PIDSet *local_1d8;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  byte *local_1b0;
  ostringstream local_1a8 [376];
  
  *discardSize = 0;
  local_234 = 0;
  local_204 = 0;
  iVar3 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&local_234,&local_204,0);
  if (local_204 == 2) {
    this->m_lastReadRez = 2;
    uVar24 = 2;
  }
  else {
    uVar24 = this->m_tmpBufferLen;
    if ((local_234 + uVar24 == 0) || ((local_234 == 0 && (this->m_lastReadRez == 1)))) {
      this->m_lastReadRez = local_204;
      uVar24 = 1;
    }
    else {
      if (local_234 != 0) {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID);
        uVar24 = this->m_tmpBufferLen;
      }
      this->m_lastReadRez = local_204;
      if (0x3fa < uVar24) {
        __assert_fail("m_tmpBufferLen <= MAX_PES_HEADER_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/programStreamDemuxer.cpp"
                      ,0xda,
                      "virtual int ProgramStreamDemuxer::simpleDemuxBlock(DemuxedData &, const PIDSet &, int64_t &)"
                     );
      }
      __src = (void *)(CONCAT44(extraout_var,iVar3) + 0x3fa);
      local_220 = demuxedData;
      if (uVar24 != 0) {
        memcpy((void *)((long)__src - (ulong)uVar24),this->m_tmpBuffer,(ulong)uVar24);
        __src = (void *)((long)__src - (ulong)this->m_tmpBufferLen);
        local_234 = local_234 + this->m_tmpBufferLen;
        this->m_tmpBufferLen = 0;
      }
      uVar21 = local_234;
      uVar24 = this->m_lastPesLen;
      pvVar18 = __src;
      local_1d8 = acceptedPIDs;
      if (uVar24 != 0) {
        uVar25 = uVar24;
        if (local_234 < uVar24) {
          uVar25 = local_234;
        }
        local_228 = discardSize;
        if (this->m_lastPID < 1) {
          *discardSize = *discardSize + (long)(int)uVar25;
        }
        else {
          pmVar4 = std::
                   map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                   ::operator[](local_220,&this->m_lastPID);
          sVar17 = (size_t)(int)uVar25;
          if (uVar21 != 0) {
            MemoryBlock::grow(pmVar4,sVar17);
            memcpy((pmVar4->m_data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + (pmVar4->m_size - sVar17),__src,sVar17);
          }
          this->m_dataProcessed = this->m_dataProcessed + sVar17;
          uVar24 = this->m_lastPesLen;
        }
        this->m_lastPesLen = uVar24 - uVar25;
        if (uVar24 - uVar25 != 0) {
          return (uint)(local_234 == 0);
        }
        pvVar18 = (void *)((long)(int)uVar25 + (long)__src);
        discardSize = local_228;
      }
      end = (byte *)((long)__src + (ulong)uVar21);
      for (pbVar14 = (byte *)((long)pvVar18 + 2); pbVar14 < end; pbVar14 = pbVar14 + lVar5) {
        lVar5 = 3;
        if (*pbVar14 < 2) {
          if (*pbVar14 == 0) {
            lVar5 = 1;
          }
          else if ((pbVar14[-2] == 0) && (pbVar14[-1] == 0)) {
            pbVar14 = pbVar14 + -2;
            pbVar6 = pbVar14 + (*discardSize - (long)pvVar18);
            *discardSize = (int64_t)pbVar6;
            pbVar19 = end + -9;
            if (pbVar19 < pbVar14) goto LAB_001c6624;
            local_1e0 = &(local_1d8->_M_t)._M_impl.super__Rb_tree_header._M_header;
            local_1f0 = &this->m_firstPtsTime;
            local_1e8 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
            local_1f8 = this->m_lpcmWaveHeader;
            pmVar22 = local_220;
            goto LAB_001c669d;
          }
        }
      }
      *discardSize = (int64_t)(end + (*discardSize - (long)pvVar18));
      pbVar14 = end;
LAB_001c6624:
      uVar23 = (uint32_t)((long)end - (long)pbVar14);
      this->m_tmpBufferLen = uVar23;
      uVar24 = 0;
      if (uVar23 != 0) {
        memmove(this->m_tmpBuffer,pbVar14,(long)end - (long)pbVar14);
      }
    }
  }
  return uVar24;
LAB_001c669d:
  bVar1 = pbVar14[3];
  local_238 = (uint)bVar1;
  bVar26 = (bVar1 & 0xbf) != 0xbd;
  if ((byte)(bVar1 + 0x41) < 0x31 || !bVar26) {
    if (end < pbVar14 + (ulong)(byte)(pbVar14[8] + 9) + 4) goto LAB_001c6624;
    local_214 = 0;
    local_238 = processPES(this,pbVar14,(uint8_t *)(ulong)bVar26,&local_214);
    p_Var11 = (local_1d8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var12 = local_1e0;
    if (p_Var11 == (_Base_ptr)0x0) {
LAB_001c6730:
      uVar2 = *(ushort *)(pbVar14 + 4) << 8 | *(ushort *)(pbVar14 + 4) >> 8;
      uVar10 = uVar2 + 6;
      if (uVar2 == 0) {
        uVar10 = 0;
      }
      uVar20 = (ulong)uVar10;
      lVar5 = (long)end - (long)pbVar14;
      if (lVar5 < (long)uVar20) {
        *discardSize = *discardSize + lVar5;
        this->m_lastPID = 0;
        this->m_lastPesLen = (uint)uVar10 - (int)lVar5;
        return 0;
      }
      pbVar6 = (byte *)(*discardSize + uVar20);
      *discardSize = (int64_t)pbVar6;
    }
    else {
      do {
        if ((int)local_238 <= (int)p_Var11[1]._M_color) {
          p_Var12 = p_Var11;
        }
        p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < (int)local_238];
      } while (p_Var11 != (_Base_ptr)0x0);
      if ((p_Var12 == local_1e0) || ((int)local_238 < (int)p_Var12[1]._M_color)) goto LAB_001c6730;
      local_228 = discardSize;
      local_1b0 = pbVar19;
      if ((char)pbVar14[7] < '\0') {
        uVar20 = (ulong)((ushort)(*(ushort *)(pbVar14 + 0xc) << 8 | *(ushort *)(pbVar14 + 0xc) >> 8)
                        >> 1) |
                 (ulong)((pbVar14[0xb] & 0xfe) << 0xe | (uint)pbVar14[10] << 0x16) |
                 (ulong)(pbVar14[9] >> 1 & 7) << 0x1e;
        if ((this->m_firstPTS == -1) || ((long)uVar20 < this->m_firstPTS)) {
          this->m_firstPTS = uVar20;
        }
        if ((((local_238 & 0xfffffff0) == 0xe0 || local_238 - 0x55 < 0xb) ||
            (((ulong)this->m_psm_es_type[local_238 & 0xff] < 0x34 &&
             ((0x8001108000000U >> ((ulong)this->m_psm_es_type[local_238 & 0xff] & 0x3f) & 1) != 0))
            )) && ((this->m_firstVideoPTS == -1 || ((long)uVar20 < this->m_firstVideoPTS)))) {
          this->m_firstVideoPTS = uVar20;
        }
        p_Var11 = (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 = local_1e8;
        pmVar22 = local_220;
        if (p_Var11 != (_Base_ptr)0x0) {
          do {
            if ((int)local_238 <= (int)*(size_t *)(p_Var11 + 1)) {
              p_Var13 = (_Rb_tree_header *)p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < (int)local_238];
          } while (p_Var11 != (_Base_ptr)0x0);
          if (((p_Var13 != local_1e8) && ((int)p_Var13->_M_node_count <= (int)local_238)) &&
             (pmVar7 = std::
                       map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                       ::operator[](local_1f0,(key_type_conflict *)&local_238),
             *pmVar7 <= (long)uVar20)) goto LAB_001c6933;
        }
        puVar8 = (ulong *)std::
                          map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                          ::operator[](local_1f0,(key_type_conflict *)&local_238);
        *puVar8 = uVar20;
      }
LAB_001c6933:
      pmVar4 = std::
               map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
               ::operator[](pmVar22,(key_type_conflict *)&local_238);
      if (((local_238 & 0xfffffff0) == 0xa0) &&
         (uVar24 = local_238 - 0xa0, this->m_lpcpHeaderAdded[uVar24] == false)) {
        sVar17 = local_1f8[uVar24].m_size;
        local_210 = pmVar4;
        if (sVar17 != 0) {
          puVar16 = local_1f8[uVar24].m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_230 = (pointer)0x0;
          if (puVar16 !=
              local_1f8[uVar24].m_data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_230 = puVar16;
          }
          MemoryBlock::grow(pmVar4,sVar17);
          memcpy((pmVar4->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (pmVar4->m_size - sVar17),local_230,
                 sVar17);
        }
        this->m_lpcpHeaderAdded[uVar24] = true;
        pmVar4 = local_210;
      }
      pbVar6 = pbVar14 + (ulong)(byte)(pbVar14[8] + 9) + (long)local_214;
      uVar2 = *(ushort *)(pbVar14 + 4) << 8 | *(ushort *)(pbVar14 + 4) >> 8;
      uVar10 = uVar2 + 6;
      if (uVar2 == 0) {
        uVar10 = 0;
      }
      uVar25 = (uint)uVar10 - ((uint)(byte)(pbVar14[8] + 9) + local_214);
      uVar21 = (int)end - (int)pbVar6;
      uVar24 = uVar21;
      if ((int)uVar25 < (int)uVar21) {
        uVar24 = uVar25;
      }
      if ((int)uVar24 < 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Invalid copyLen",0xf);
        puVar9 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar9 = 3;
        *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
        if (local_1d0 == &local_1c0) {
          puVar9[6] = local_1c0;
          puVar9[7] = uStack_1bc;
          puVar9[8] = uStack_1b8;
          puVar9[9] = uStack_1b4;
        }
        else {
          *(uint **)(puVar9 + 2) = local_1d0;
          *(ulong *)(puVar9 + 6) = CONCAT44(uStack_1bc,local_1c0);
        }
        *(undefined8 *)(puVar9 + 4) = local_1c8;
        local_1c8 = 0;
        local_1c0 = local_1c0 & 0xffffff00;
        local_1d0 = &local_1c0;
        __cxa_throw(puVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      puVar16 = (pointer)(ulong)uVar24;
      if (uVar24 != 0) {
        local_230 = puVar16;
        local_210 = pmVar4;
        local_200 = pbVar6;
        MemoryBlock::grow(pmVar4,(size_t)puVar16);
        memcpy((local_210->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start + (local_210->m_size - (long)local_230),
               local_200,(size_t)local_230);
        puVar16 = local_230;
        pbVar6 = local_200;
      }
      this->m_dataProcessed = (int64_t)(puVar16 + this->m_dataProcessed);
      pbVar6 = pbVar6 + (*local_228 - (long)pbVar14);
      *local_228 = (long)pbVar6;
      if ((int)uVar21 < (int)uVar25) {
        this->m_lastPesLen = uVar25 - uVar24;
        this->m_lastPID = local_238;
        return 0;
      }
      uVar2 = *(ushort *)(pbVar14 + 4) << 8 | *(ushort *)(pbVar14 + 4) >> 8;
      uVar10 = uVar2 + 6;
      if (uVar2 == 0) {
        uVar10 = 0;
      }
      uVar20 = (ulong)uVar10;
      pbVar19 = local_1b0;
      pmVar22 = local_220;
      discardSize = local_228;
    }
    pbVar15 = pbVar14 + uVar20;
  }
  else {
    if (bVar1 == 0xbc) {
      uVar24 = mpegps_psm_parse(this,pbVar14,end);
      if (uVar24 != 0xffffffff) {
        uVar20 = (ulong)uVar24;
        lVar5 = (long)end - (long)pbVar14;
        if (lVar5 < (long)uVar20) {
          *discardSize = *discardSize + lVar5;
          this->m_lastPID = 0;
          this->m_lastPesLen = uVar24 - (int)lVar5;
          return 0;
        }
        pbVar6 = (byte *)(*discardSize + uVar20);
        *discardSize = (int64_t)pbVar6;
        pbVar15 = pbVar14 + uVar20;
        goto LAB_001c67c0;
      }
      goto LAB_001c6624;
    }
    lVar5 = (long)end - (long)pbVar14;
    if (3 < lVar5) {
      lVar5 = 4;
    }
    pbVar15 = pbVar14 + lVar5;
    pbVar6 = pbVar6 + lVar5;
    *discardSize = (int64_t)pbVar6;
  }
LAB_001c67c0:
  pbVar14 = pbVar15 + 2;
  do {
    if (end <= pbVar14) {
      *discardSize = (int64_t)(end + ((long)pbVar6 - (long)pbVar15));
      pbVar14 = end;
      goto LAB_001c6624;
    }
    lVar5 = 3;
    if (*pbVar14 < 2) {
      if (*pbVar14 == 0) {
        lVar5 = 1;
      }
      else if ((pbVar14[-2] == 0) && (pbVar14[-1] == 0)) break;
    }
    pbVar14 = pbVar14 + lVar5;
  } while( true );
  pbVar14 = pbVar14 + -2;
  pbVar6 = pbVar14 + ((long)pbVar6 - (long)pbVar15);
  *discardSize = (int64_t)pbVar6;
  if (pbVar19 < pbVar14) goto LAB_001c6624;
  goto LAB_001c669d;
}

Assistant:

int ProgramStreamDemuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    discardSize = 0;
    uint32_t readedBytes = 0;
    int readRez = 0;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }
    if (readedBytes + m_tmpBufferLen == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);

    m_lastReadRez = readRez;
    data += MAX_PES_HEADER_SIZE;
    assert(m_tmpBufferLen <= MAX_PES_HEADER_SIZE);
    if (m_tmpBufferLen > 0)
    {
        memcpy(data - m_tmpBufferLen, m_tmpBuffer, m_tmpBufferLen);
        data -= m_tmpBufferLen;
        readedBytes += m_tmpBufferLen;
        m_tmpBufferLen = 0;
    }

    uint8_t* end = data + readedBytes;
    uint8_t* curBuf = data;

    if (m_lastPesLen > 0)
    {
        const int copyLen = FFMIN(readedBytes, m_lastPesLen);
        if (m_lastPID > 0)
        {
            StreamData& vect = demuxedData[m_lastPID];
            vect.append(curBuf, copyLen);
            m_dataProcessed += copyLen;
        }
        else
            discardSize += copyLen;
        curBuf += copyLen;
        m_lastPesLen -= copyLen;
        if (m_lastPesLen > 0)
        {
            if (readedBytes > 0)
                return 0;
            return BufferedReader::DATA_EOF;
        }
    }

    const uint8_t* prevBuf = curBuf;
    curBuf = MPEGHeader::findNextMarker(curBuf, end);
    discardSize += curBuf - prevBuf;

    while (curBuf <= end - 9)
    {
        const auto pesPacket = reinterpret_cast<PESPacket*>(curBuf);
        int startcode = curBuf[3];
        if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) || (startcode == PES_VC1_ID) ||
            (startcode == PES_PRIVATE_DATA2))
        {
            if (curBuf + pesPacket->getHeaderLength() + 4 > end)
                break;
            int afterPesHeader = 0;
            startcode = processPES(curBuf, end, afterPesHeader);
            if (acceptedPIDs.find(startcode) != acceptedPIDs.end())
            {
                if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    const int64_t curPts = pesPacket->getPts();
                    if (m_firstPTS == -1 || curPts < m_firstPTS)
                        m_firstPTS = curPts;
                    if (isVideoPID(startcode) && (m_firstVideoPTS == -1 || curPts < m_firstVideoPTS))
                        m_firstVideoPTS = curPts;
                    if (m_firstPtsTime.find(startcode) == m_firstPtsTime.end() || curPts < m_firstPtsTime[startcode])
                        m_firstPtsTime[startcode] = curPts;
                }

                StreamData& vect = demuxedData[startcode];

                const int idx = startcode - 0xa0;
                if (idx >= 0 && idx <= 15 && !m_lpcpHeaderAdded[idx])
                {
                    vect.append(m_lpcmWaveHeader[idx].data(), m_lpcmWaveHeader[idx].size());
                    m_lpcpHeaderAdded[idx] = true;
                }

                const uint8_t* payloadData = curBuf + pesPacket->getHeaderLength() + afterPesHeader;
                const int pesPayloadLen = pesPacket->getPacketLength() - pesPacket->getHeaderLength() - afterPesHeader;
                const int copyLen = FFMIN(pesPayloadLen, (int)(end - payloadData));
                if (copyLen < 0)
                {
                    THROW(ERR_COMMON, "Invalid copyLen")
                }
                vect.append(payloadData, copyLen);
                m_dataProcessed += copyLen;
                discardSize += payloadData - curBuf;
                if (copyLen < pesPayloadLen)
                {
                    m_lastPesLen = pesPayloadLen - copyLen;
                    m_lastPID = startcode;
                    return 0;
                }
                curBuf += pesPacket->getPacketLength();
            }
            else
            {
                const int tmpLen = pesPacket->getPacketLength();
                if (tmpLen > end - curBuf)
                {
                    discardSize += end - curBuf;
                    m_lastPID = 0;
                    m_lastPesLen = tmpLen - static_cast<int>(end - curBuf);
                    return 0;
                }
                curBuf += tmpLen;
                discardSize += tmpLen;
            }
        }
        else if (startcode == PES_PROGRAM_STREAM_MAP)
        {
            const int psmLen = mpegps_psm_parse(curBuf, end);
            if (psmLen == -1)
                break;
            if (psmLen > end - curBuf)
            {
                discardSize += end - curBuf;
                m_lastPID = 0;
                m_lastPesLen = psmLen - static_cast<int>(end - curBuf);
                return 0;
            }
            discardSize += psmLen;
            curBuf += psmLen;
        }
        else
        {
            const int64_t rest = FFMIN(end - curBuf, 4);
            curBuf += rest;
            discardSize += rest;
        }
        prevBuf = curBuf;
        curBuf = MPEGHeader::findNextMarker(curBuf, end);
        discardSize += curBuf - prevBuf;
    }
    m_tmpBufferLen = static_cast<uint32_t>(end - curBuf);
    if (m_tmpBufferLen > 0)
        memmove(m_tmpBuffer, curBuf, end - curBuf);
    return 0;
}